

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O0

char * nivalis::OpCode::latex_repr(uint32_t opcode)

{
  uint32_t opcode_local;
  char *local_8;
  
  if (opcode == 0) {
    local_8 = "nan";
  }
  else if (opcode == 1) {
    local_8 = "\v";
  }
  else if (opcode == 2) {
    local_8 = "\r";
  }
  else if (opcode == 3) {
    local_8 = "$";
  }
  else if (opcode == 8) {
    local_8 = "@@";
  }
  else if (opcode == 9) {
    local_8 = "";
  }
  else if (opcode == 0xc) {
    local_8 = "\t(@)";
  }
  else if (opcode == 0x10) {
    local_8 = "\\left\\{@:@,@\\right\\}";
  }
  else if (opcode == 0x11) {
    local_8 = "\\sum_{\r=@}^{@}\\left(@\\right)";
  }
  else if (opcode == 0x12) {
    local_8 = "\\prod_{\r=@}^{@}\\left(@\\right)";
  }
  else if (opcode == 0x18) {
    local_8 = "\\left\\{0:@,@\\right\\}";
  }
  else if (opcode == 0x20) {
    local_8 = "\\left(@+@\\right)";
  }
  else if (opcode == 0x21) {
    local_8 = "\\left(@-@\\right)";
  }
  else if (opcode == 0x30) {
    local_8 = "\\left(@\\cdot @\\right)";
  }
  else if (opcode == 0x31) {
    local_8 = "\\frac{@}{@}";
  }
  else if (opcode == 0x32) {
    local_8 = "\\operatorname{mod}\\left(@, @\\right)";
  }
  else if (opcode == 0x40) {
    local_8 = "@^{@}";
  }
  else if (opcode == 0x41) {
    local_8 = "\\log\\left(@, @\\right)";
  }
  else if (opcode == 0x50) {
    local_8 = "\\max\\left(@, @\\right)";
  }
  else if (opcode == 0x51) {
    local_8 = "\\min\\left(@, @\\right)";
  }
  else if (opcode == 0x52) {
    local_8 = "\\left(@\\wedge @\\right)";
  }
  else if (opcode == 0x53) {
    local_8 = "\\left(@\\vee @\\right)";
  }
  else if (opcode == 0x54) {
    local_8 = "xor\\left(@, @\\right)";
  }
  else if (opcode == 0x60) {
    local_8 = "\\left(@ < @\\right)";
  }
  else if (opcode == 0x61) {
    local_8 = "\\left(@ \\le @\\right)";
  }
  else if (opcode == 0x62) {
    local_8 = "\\left(@ = @\\right)";
  }
  else if (opcode == 99) {
    local_8 = "\\left(@ \\ne @\\right)";
  }
  else if (opcode == 100) {
    local_8 = "\\left(@ \\ge @\\right)";
  }
  else if (opcode == 0x65) {
    local_8 = "\\left(@ > @\\right)";
  }
  else if (opcode == 0x4000) {
    local_8 = "\\gcd\\left(@,@\\right)";
  }
  else if (opcode == 0x4001) {
    local_8 = "\\lcm\\left(@,@\\right)";
  }
  else if (opcode == 0x4002) {
    local_8 = "\\choose\\left(@,@\\right)";
  }
  else if (opcode == 0x4003) {
    local_8 = "\\fafact\\left(@,@\\right)";
  }
  else if (opcode == 0x4004) {
    local_8 = "\\rifact\\left(@,@\\right)";
  }
  else if (opcode == 0x4005) {
    local_8 = "B\\left(@,@\\right)";
  }
  else if (opcode == 0x4006) {
    local_8 = "\\polygamma\\left(@,@\\right)";
  }
  else if (opcode == 0x8000) {
    local_8 = "(-@)";
  }
  else if (opcode == 0x8001) {
    local_8 = "\\not\\left(@\\right)";
  }
  else if (opcode == 0x8002) {
    local_8 = "\\left|@\\right|";
  }
  else if (opcode == 0x8003) {
    local_8 = "\\sqrt\\left{@\\right}";
  }
  else if (opcode == 0x8004) {
    local_8 = "@^{2}";
  }
  else if (opcode == 0x8005) {
    local_8 = "\\sgn\\left(@\\right)";
  }
  else if (opcode == 0x8006) {
    local_8 = "\\floor\\left(@\\right)";
  }
  else if (opcode == 0x8007) {
    local_8 = "\\ceil\\left(@\\right)";
  }
  else if (opcode == 0x8008) {
    local_8 = "\\round\\left(@\\right)";
  }
  else if (opcode == 0x8009) {
    local_8 = "\\exp\\left(@\\right)";
  }
  else if (opcode == 0x800a) {
    local_8 = "2^{@}";
  }
  else if (opcode == 0x800b) {
    local_8 = "\\ln\\left(@\\right)";
  }
  else if (opcode == 0x800c) {
    local_8 = "\\log_{10}\\left(@\\right)";
  }
  else if (opcode == 0x800d) {
    local_8 = "\\log_{2}\\left(@\\right)";
  }
  else if (opcode == 0x800e) {
    local_8 = "\\fact\\left(@\\right)";
  }
  else if (opcode == 0x800f) {
    local_8 = "\\sin\\left(@\\right)";
  }
  else if (opcode == 0x8010) {
    local_8 = "\\cos\\left(@\\right)";
  }
  else if (opcode == 0x8011) {
    local_8 = "\\tan\\left(@\\right)";
  }
  else if (opcode == 0x8012) {
    local_8 = "\\arcsin\\left(@\\right)";
  }
  else if (opcode == 0x8013) {
    local_8 = "\\arccos\\left(@\\right)";
  }
  else if (opcode == 0x8014) {
    local_8 = "\\arctan\\left(@\\right)";
  }
  else if (opcode == 0x8015) {
    local_8 = "\\sinh\\left(@\\right)";
  }
  else if (opcode == 0x8016) {
    local_8 = "\\cosh\\left(@\\right)";
  }
  else if (opcode == 0x8017) {
    local_8 = "\\tanh\\left(@\\right)";
  }
  else if (opcode == 0x8018) {
    local_8 = "\\Gamma\\left(@\\right)";
  }
  else if (opcode == 0x8019) {
    local_8 = "\\operatorname{lgamma}\\left(@\\right)";
  }
  else if (opcode == 0x801a) {
    local_8 = "\\psi_{0}\\left(@\\right)";
  }
  else if (opcode == 0x801b) {
    local_8 = "\\psi_{1}\\left(@\\right)";
  }
  else if (opcode == 0x801c) {
    local_8 = "\\erf\\left(@\\right)";
  }
  else if (opcode == 0x801d) {
    local_8 = "\\zeta\\left(@\\right)";
  }
  else if (opcode == 0x801e) {
    local_8 = "\\sigmoid\\left(@\\right)";
  }
  else if (opcode == 0x801f) {
    local_8 = "\\softplus\\left(@\\right)";
  }
  else if (opcode == 0x8020) {
    local_8 = "\\gausspdf\\left(@\\right)";
  }
  else {
    local_8 = "";
  }
  return local_8;
}

Assistant:

const char* latex_repr(uint32_t opcode) {
    using namespace OpCode;
    switch (opcode) {
        case OpCode::null:  return "nan";
        case val:   return "\v";
        case ref:   return "\r";
        case sums:     return "\\sum_{\r=@}^{@}\\left(@\\right)";
        case prods:    return "\\prod_{\r=@}^{@}\\left(@\\right)";
        case bnz:   return "\\left\\{@:@,@\\right\\}";
        case bsel:  return "\\left\\{0:@,@\\right\\}";
        case add:   return "\\left(@+@\\right)";
        case sub:   return "\\left(@-@\\right)";
        case mul:   return "\\left(@\\cdot @\\right)";
        case divi:   return "\\frac{@}{@}";
        case mod:   return "\\operatorname{mod}\\left(@, @\\right)";
        case power: return "@^{@}";
        case logbase:  return "\\log\\left(@, @\\right)";
        case max:   return "\\max\\left(@, @\\right)";
        case min:   return "\\min\\left(@, @\\right)";
        case land:  return "\\left(@\\wedge @\\right)";
        case lor:   return "\\left(@\\vee @\\right)";
        case lxor:  return "xor\\left(@, @\\right)";
        case lt:    return "\\left(@ < @\\right)";
        case le:    return "\\left(@ \\le @\\right)";
        case eq:    return "\\left(@ = @\\right)";
        case ne:    return "\\left(@ \\ne @\\right)";
        case ge:    return "\\left(@ \\ge @\\right)";
        case gt:    return "\\left(@ > @\\right)";
        case gcd:   return "\\gcd\\left(@,@\\right)";
        case lcm:   return "\\lcm\\left(@,@\\right)";
        case choose:    return "\\choose\\left(@,@\\right)";
        case fafact:    return "\\fafact\\left(@,@\\right)";
        case rifact:    return "\\rifact\\left(@,@\\right)";
        case betab:      return "B\\left(@,@\\right)";
        case polygammab: return "\\polygamma\\left(@,@\\right)";
        case unaryminus:   return "(-@)";
        case lnot:     return "\\not\\left(@\\right)";
        case absb:      return "\\left|@\\right|";
        case sqrtb:     return "\\sqrt\\left{@\\right}";
        case sqrb:      return "@^{2}";
        case sgn:      return "\\sgn\\left(@\\right)";
        case floorb:    return "\\floor\\left(@\\right)";
        case ceilb:     return "\\ceil\\left(@\\right)";
        case roundb:    return "\\round\\left(@\\right)";
        case expb:      return "\\exp\\left(@\\right)";
        case exp2b:     return "2^{@}";
        case logb:      return "\\ln\\left(@\\right)";
        case log10b:    return "\\log_{10}\\left(@\\right)";
        case log2b:     return "\\log_{2}\\left(@\\right)";
        case factb:     return "\\fact\\left(@\\right)";
        case sinb:      return "\\sin\\left(@\\right)";
        case cosb:      return "\\cos\\left(@\\right)";
        case tanb:      return "\\tan\\left(@\\right)";
        case asinb:     return "\\arcsin\\left(@\\right)";
        case acosb:     return "\\arccos\\left(@\\right)";
        case atanb:     return "\\arctan\\left(@\\right)";
        case sinhb:     return "\\sinh\\left(@\\right)";
        case coshb:     return "\\cosh\\left(@\\right)";
        case tanhb:     return "\\tanh\\left(@\\right)";
        case tgammab:    return "\\Gamma\\left(@\\right)";
        case lgammab:   return "\\operatorname{lgamma}\\left(@\\right)";
        case digammab:  return "\\psi_{0}\\left(@\\right)";
        case trigammab: return "\\psi_{1}\\left(@\\right)";
        case erfb:      return "\\erf\\left(@\\right)";
        case zetab:     return "\\zeta\\left(@\\right)";
        case sigmoidb:     return "\\sigmoid\\left(@\\right)";
        case softplusb:     return "\\softplus\\left(@\\right)";
        case gausspdfb:     return "\\gausspdf\\left(@\\right)";
        case thunk_jmp: return "";
        case thunk_ret: return "@@";
        case arg: return "$";
        case call: return "\t(@)";
        default: return "";
    };
}